

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<MaterialDataV,_10>::Resize(TPZManVector<MaterialDataV,_10> *this,int64_t newsize)

{
  long *plVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong *puVar5;
  long lVar6;
  MaterialDataV *pMVar7;
  TPZManVector<double,_10> *this_00;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  string *psVar11;
  double dVar12;
  
  if (-1 < newsize) {
    lVar6 = (this->super_TPZVec<MaterialDataV>).fNElements;
    if (lVar6 != newsize) {
      lVar8 = (this->super_TPZVec<MaterialDataV>).fNAlloc;
      if (lVar8 < newsize) {
        if ((ulong)newsize < 0xb) {
          pMVar7 = (this->super_TPZVec<MaterialDataV>).fStore;
          if (pMVar7 != this->fExtAlloc) {
            if (0 < lVar6) {
              psVar11 = (string *)&this->fExtAlloc[0].fMaterial;
              lVar6 = 0x28;
              lVar8 = 0;
              do {
                pMVar7 = (this->super_TPZVec<MaterialDataV>).fStore;
                *(undefined4 *)(psVar11 + -8) =
                     *(undefined4 *)
                      ((long)(pMVar7->fProperties).super_TPZManVector<double,_10>.fExtAlloc +
                      lVar6 + -0x70);
                std::__cxx11::string::_M_assign(psVar11);
                TPZManVector<double,_10>::operator=
                          ((TPZManVector<double,_10> *)(psVar11 + 0x20),
                           (TPZManVector<double,_10> *)
                           ((long)(pMVar7->fProperties).super_TPZManVector<double,_10>.fExtAlloc +
                           lVar6 + -0x48));
                lVar8 = lVar8 + 1;
                psVar11 = psVar11 + 0x98;
                lVar6 = lVar6 + 0x98;
              } while (lVar8 < (this->super_TPZVec<MaterialDataV>).fNElements);
              pMVar7 = (this->super_TPZVec<MaterialDataV>).fStore;
            }
            if (pMVar7 != (MaterialDataV *)0x0) {
              dVar12 = pMVar7[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
              if (dVar12 != 0.0) {
                lVar6 = (long)dVar12 * 0x98;
                do {
                  TPZManVector<double,_10>::~TPZManVector
                            ((TPZManVector<double,_10> *)((long)pMVar7 + lVar6 + -0x70));
                  plVar1 = (long *)((long)pMVar7 + lVar6 + -0x80);
                  plVar2 = *(long **)((long)pMVar7 + lVar6 + -0x90);
                  if (plVar1 != plVar2) {
                    operator_delete(plVar2,*plVar1 + 1);
                  }
                  lVar6 = lVar6 + -0x98;
                } while (lVar6 != 0);
              }
              operator_delete__(pMVar7[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                                (long)dVar12 * 0x98 + 8);
            }
            (this->super_TPZVec<MaterialDataV>).fStore = this->fExtAlloc;
          }
          (this->super_TPZVec<MaterialDataV>).fNElements = newsize;
          (this->super_TPZVec<MaterialDataV>).fNAlloc = 0;
        }
        else {
          dVar12 = (double)lVar8 * 1.2;
          uVar10 = (long)dVar12;
          if (dVar12 < (double)newsize) {
            uVar10 = newsize;
          }
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar10;
          uVar4 = SUB168(auVar3 * ZEXT816(0x98),0);
          uVar9 = uVar4 + 8;
          if (0xfffffffffffffff7 < uVar4) {
            uVar9 = 0xffffffffffffffff;
          }
          if (SUB168(auVar3 * ZEXT816(0x98),8) != 0) {
            uVar9 = 0xffffffffffffffff;
          }
          puVar5 = (ulong *)operator_new__(uVar9);
          *puVar5 = uVar10;
          if (uVar10 != 0) {
            lVar6 = 0;
            pMVar7 = (MaterialDataV *)(puVar5 + 1);
            do {
              MaterialDataV::MaterialDataV(pMVar7);
              lVar6 = lVar6 + -0x98;
              pMVar7 = pMVar7 + 1;
            } while (uVar10 * -0x98 - lVar6 != 0);
            lVar6 = (this->super_TPZVec<MaterialDataV>).fNElements;
          }
          if (0 < lVar6) {
            this_00 = (TPZManVector<double,_10> *)(puVar5 + 6);
            lVar8 = 0x28;
            lVar6 = 0;
            do {
              pMVar7 = (this->super_TPZVec<MaterialDataV>).fStore;
              *(undefined4 *)(this_00[-1].fExtAlloc + 5) =
                   *(undefined4 *)
                    ((long)(pMVar7->fProperties).super_TPZManVector<double,_10>.fExtAlloc +
                    lVar8 + -0x70);
              std::__cxx11::string::_M_assign((string *)(this_00[-1].fExtAlloc + 6));
              TPZManVector<double,_10>::operator=
                        (this_00,(TPZManVector<double,_10> *)
                                 ((long)(pMVar7->fProperties).super_TPZManVector<double,_10>.
                                        fExtAlloc + lVar8 + -0x48));
              lVar6 = lVar6 + 1;
              this_00 = (TPZManVector<double,_10> *)(this_00[1].fExtAlloc + 1);
              lVar8 = lVar8 + 0x98;
            } while (lVar6 < (this->super_TPZVec<MaterialDataV>).fNElements);
          }
          pMVar7 = (this->super_TPZVec<MaterialDataV>).fStore;
          if (pMVar7 != (MaterialDataV *)0x0 && pMVar7 != this->fExtAlloc) {
            dVar12 = pMVar7[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
            if (dVar12 != 0.0) {
              lVar6 = (long)dVar12 * 0x98;
              do {
                TPZManVector<double,_10>::~TPZManVector
                          ((TPZManVector<double,_10> *)((long)pMVar7 + lVar6 + -0x70));
                plVar1 = (long *)((long)pMVar7 + lVar6 + -0x80);
                plVar2 = *(long **)((long)pMVar7 + lVar6 + -0x90);
                if (plVar1 != plVar2) {
                  operator_delete(plVar2,*plVar1 + 1);
                }
                lVar6 = lVar6 + -0x98;
              } while (lVar6 != 0);
            }
            operator_delete__(pMVar7[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                              (long)dVar12 * 0x98 + 8);
          }
          (this->super_TPZVec<MaterialDataV>).fStore = (MaterialDataV *)(puVar5 + 1);
          (this->super_TPZVec<MaterialDataV>).fNElements = newsize;
          (this->super_TPZVec<MaterialDataV>).fNAlloc = uVar10;
        }
      }
      else {
        (this->super_TPZVec<MaterialDataV>).fNElements = newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}